

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryFuncs.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ast::builtins::IsUnboundedFunction::eval
          (ConstantValue *__return_storage_ptr__,IsUnboundedFunction *this,EvalContext *context,
          Args *args,SourceRange range,SystemCallInfo *param_4)

{
  SourceRange referencingRange;
  bool bVar1;
  reference ppEVar2;
  Type *this_00;
  ParameterSymbol *this_01;
  ConstantValue *this_02;
  SVInt local_90;
  SVInt local_80;
  IsUnboundedFunction *local_70;
  SourceLocation local_68;
  Symbol *local_60;
  Symbol *sym;
  SVInt local_48;
  Args *local_38;
  Args *args_local;
  EvalContext *context_local;
  IsUnboundedFunction *this_local;
  SourceRange range_local;
  
  range_local.startLoc = range.endLoc;
  this_local = (IsUnboundedFunction *)range.startLoc;
  local_38 = args;
  args_local = (Args *)context;
  context_local = (EvalContext *)this;
  range_local.endLoc = (SourceLocation)__return_storage_ptr__;
  ppEVar2 = nonstd::span_lite::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::
            operator[](args,0);
  SystemSubroutine::noHierarchical(&this->super_SystemSubroutine,context,*ppEVar2);
  ppEVar2 = nonstd::span_lite::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::
            operator[](local_38,0);
  this_00 = not_null<const_slang::ast::Type_*>::operator->(&(*ppEVar2)->type);
  bVar1 = Type::isUnbounded(this_00);
  if (bVar1) {
    SVInt::SVInt(&local_48,1,1,false);
    slang::ConstantValue::ConstantValue(__return_storage_ptr__,&local_48);
    SVInt::~SVInt(&local_48);
  }
  else {
    ppEVar2 = nonstd::span_lite::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::
              operator[](local_38,0);
    if ((*ppEVar2)->kind == NamedValue) {
      ppEVar2 = nonstd::span_lite::span<const_slang::ast::Expression_*const,_18446744073709551615UL>
                ::operator[](local_38,0);
      local_60 = Expression::getSymbolReference(*ppEVar2,true);
      if ((local_60 != (Symbol *)0x0) && (local_60->kind == Parameter)) {
        this_01 = Symbol::as<slang::ast::ParameterSymbol>(local_60);
        local_70 = this_local;
        local_68 = range_local.startLoc;
        referencingRange.endLoc = range_local.startLoc;
        referencingRange.startLoc = (SourceLocation)this_local;
        this_02 = ParameterSymbol::getValue(this_01,referencingRange);
        bVar1 = slang::ConstantValue::isUnbounded(this_02);
        if (bVar1) {
          SVInt::SVInt(&local_80,1,1,false);
          slang::ConstantValue::ConstantValue(__return_storage_ptr__,&local_80);
          SVInt::~SVInt(&local_80);
          return __return_storage_ptr__;
        }
      }
    }
    SVInt::SVInt(&local_90,1,0,false);
    slang::ConstantValue::ConstantValue(__return_storage_ptr__,&local_90);
    SVInt::~SVInt(&local_90);
  }
  return __return_storage_ptr__;
}

Assistant:

ConstantValue eval(EvalContext& context, const Args& args, SourceRange range,
                       const CallExpression::SystemCallInfo&) const final {
        noHierarchical(context, *args[0]);

        if (args[0]->type->isUnbounded())
            return SVInt(1, 1, false);

        if (args[0]->kind == ExpressionKind::NamedValue) {
            auto sym = args[0]->getSymbolReference();
            if (sym && sym->kind == SymbolKind::Parameter &&
                sym->as<ParameterSymbol>().getValue(range).isUnbounded())
                return SVInt(1, 1, false);
        }

        return SVInt(1, 0, false);
    }